

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::
visitDefault<slang::ast::StatementBlockSymbol>
          (ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *this,StatementBlockSymbol *t)

{
  bool bVar1;
  Symbol *this_00;
  Symbol *member;
  iterator __end0;
  iterator __begin0;
  iterator_range<slang::ast::Scope::iterator> *__range4;
  StatementBlockSymbol *t_local;
  ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *this_local;
  
  ___begin0 = Scope::members(&t->super_Scope);
  __end0 = iterator_range<slang::ast::Scope::iterator>::begin
                     ((iterator_range<slang::ast::Scope::iterator> *)&__begin0);
  member = (Symbol *)
           iterator_range<slang::ast::Scope::iterator>::end
                     ((iterator_range<slang::ast::Scope::iterator> *)&__begin0);
  while( true ) {
    bVar1 = iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
            ::operator!=((iterator_facade<slang::ast::Scope::iterator,_std::forward_iterator_tag,_const_slang::ast::Symbol,_long,_const_slang::ast::Symbol_*,_const_slang::ast::Symbol_&>
                          *)&__end0,(iterator *)&member);
    if (!bVar1) break;
    this_00 = Scope::iterator::operator*(&__end0);
    Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,(DiagnosticVisitor *)this);
    Scope::iterator::operator++(&__end0);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && is_detected_v<visitExprs_t, T, TDerived>) {
            t.visitExprs(DERIVED);
        }

        if constexpr (VisitStatements && is_detected_v<visitStmts_t, T, TDerived>) {
            t.visitStmts(DERIVED);
        }

        if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }